

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

optional<toml::detail::multiline_spacer<toml::type_config>_> *
toml::detail::skip_multiline_spacer<toml::type_config>
          (optional<toml::detail::multiline_spacer<toml::type_config>_> *__return_storage_ptr__,
          location *loc,context<toml::type_config> *ctx,bool newline_found)

{
  element_type *peVar1;
  bool bVar2;
  bool bVar3;
  multiline_spacer<toml::type_config> spacer;
  repeat_at_least local_1f8;
  character local_1e0;
  string comment;
  region tabs;
  region sp;
  region comm;
  
  spacer.comments.comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  spacer.comments.comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  spacer.comments.comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  spacer.indent_type = none;
  spacer.indent = 0;
  spacer.newline_found = newline_found;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&spacer.comments);
  bVar2 = false;
  do {
    peVar1 = (loc->source_).
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if ((ulong)((long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start) <= loc->location_) break;
    syntax::comment((sequence *)&sp,&ctx->toml_spec_);
    syntax::newline((either *)&tabs,&ctx->toml_spec_);
    sequence::sequence<toml::detail::sequence,toml::detail::either>
              ((sequence *)&comment,(sequence *)&sp,(either *)&tabs);
    sequence::scan(&comm,(sequence *)&comment,loc);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *
            )&comment._M_string_length);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *
            )&tabs.source_.
              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *
            )&sp.source_.
              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
    if (comm.source_.
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr == (element_type *)0x0) {
      syntax::newline((either *)&sp,&ctx->toml_spec_);
      either::scan((region *)&comment,(either *)&sp,loc);
      std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
      ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
               *)&sp.source_.
                  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      if (comment._M_dataplus._M_p == (pointer)0x0) {
        local_1f8.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_00499940;
        local_1f8.length_._0_1_ = 0x20;
        repeat_at_least::repeat_at_least<toml::detail::character>
                  ((repeat_at_least *)&tabs,1,(character *)&local_1f8);
        repeat_at_least::scan(&sp,(repeat_at_least *)&tabs,loc);
        if (tabs.source_name_._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)tabs.source_name_._M_dataplus._M_p + 8))();
        }
        if (sp.source_.
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr == (element_type *)0x0) {
          local_1e0.super_scanner_base._vptr_scanner_base =
               (_func_int **)&PTR__scanner_base_00499940;
          local_1e0.value_ = '\t';
          repeat_at_least::repeat_at_least<toml::detail::character>(&local_1f8,1,&local_1e0);
          repeat_at_least::scan(&tabs,&local_1f8,loc);
          if (local_1f8.other_.scanner_._M_t.
              super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
              ._M_t.
              super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
              .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
              (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
               )0x0) {
            (*(*(_func_int ***)
                local_1f8.other_.scanner_._M_t.
                super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                ._M_t.
                super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
                .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl)[1])();
          }
          bVar3 = tabs.source_.
                  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr != (element_type *)0x0;
          if (bVar3) {
            spacer.indent_type = tab;
            spacer.indent = (int32_t)tabs.length_;
            bVar2 = true;
          }
          region::~region(&tabs);
        }
        else {
          spacer.indent_type = space;
          spacer.indent = (int32_t)sp.length_;
          bVar2 = true;
          bVar3 = true;
        }
        region::~region(&sp);
      }
      else {
        spacer.newline_found = true;
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&spacer.comments);
        spacer.indent_type = none;
        spacer.indent = 0;
        bVar2 = true;
        bVar3 = true;
      }
      region::~region((region *)&comment);
    }
    else {
      spacer.newline_found = true;
      region::as_string_abi_cxx11_(&comment,&comm);
      if ((comment._M_string_length != 0) &&
         (comment._M_dataplus._M_p[comment._M_string_length - 1] == '\n')) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment);
        if ((comment._M_string_length != 0) &&
           (comment._M_dataplus._M_p[comment._M_string_length - 1] == '\r')) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment);
        }
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &spacer.comments,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment);
      spacer.indent_type = none;
      spacer.indent = 0;
      std::__cxx11::string::~string((string *)&comment);
      bVar2 = true;
      bVar3 = true;
    }
    region::~region(&comm);
  } while (bVar3);
  if (bVar2) {
    std::optional<toml::detail::multiline_spacer<toml::type_config>_>::
    optional<toml::detail::multiline_spacer<toml::type_config>,_true>
              (__return_storage_ptr__,&spacer);
  }
  else {
    (__return_storage_ptr__->
    super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>).
    _M_payload.
    super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>.
    super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>._M_engaged =
         false;
  }
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&spacer.comments);
  return __return_storage_ptr__;
}

Assistant:

cxx::optional<multiline_spacer<TC>>
skip_multiline_spacer(location& loc, context<TC>& ctx, const bool newline_found = false)
{
    const auto& spec = ctx.toml_spec();

    multiline_spacer<TC> spacer;
    spacer.newline_found = newline_found;
    spacer.indent_type   = indent_char::none;
    spacer.indent        = 0;
    spacer.comments.clear();

    bool spacer_found = false;
    while( ! loc.eof())
    {
        if(auto comm = sequence(syntax::comment(spec), syntax::newline(spec)).scan(loc))
        {
            spacer.newline_found = true;
            auto comment = comm.as_string();
            if( ! comment.empty() && comment.back() == '\n')
            {
                comment.pop_back();
                if (!comment.empty() && comment.back() == '\r')
                {
                    comment.pop_back();
                }
            }

            spacer.comments.push_back(std::move(comment));
            spacer.indent_type = indent_char::none;
            spacer.indent = 0;
            spacer_found = true;
        }
        else if(auto nl = syntax::newline(spec).scan(loc))
        {
            spacer.newline_found = true;
            spacer.comments.clear();
            spacer.indent_type = indent_char::none;
            spacer.indent = 0;
            spacer_found = true;
        }
        else if(auto sp = repeat_at_least(1, character(cxx::bit_cast<location::char_type>(' '))).scan(loc))
        {
            spacer.indent_type = indent_char::space;
            spacer.indent      = static_cast<std::int32_t>(sp.length());
            spacer_found = true;
        }
        else if(auto tabs = repeat_at_least(1, character(cxx::bit_cast<location::char_type>('\t'))).scan(loc))
        {
            spacer.indent_type = indent_char::tab;
            spacer.indent      = static_cast<std::int32_t>(tabs.length());
            spacer_found = true;
        }
        else
        {
            break; // done
        }
    }
    if( ! spacer_found)
    {
        return cxx::make_nullopt();
    }
    return spacer;
}